

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaParser::ReadControllerJoints(ColladaParser *this,Controller *pController)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  char *pcVar5;
  char *pcVar6;
  undefined4 extraout_var_02;
  ostream *poVar7;
  string *psVar8;
  char *attrSemantic;
  string local_1d8;
  char *local_1b8;
  char *local_1b0;
  string local_1a8 [11];
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar2 != '\0') {
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"input");
        if (iVar2 == 0) {
          uVar4 = GetAttribute(this,"semantic");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
          pcVar5 = (char *)CONCAT44(extraout_var_00,iVar2);
          local_1b0 = pcVar5;
          uVar4 = GetAttribute(this,"source");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
          pcVar6 = (char *)CONCAT44(extraout_var_01,iVar2);
          local_1b8 = pcVar6;
          if (*pcVar6 != '#') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unsupported URL format in \"",0x1b);
            poVar7 = (ostream *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )local_1a8,&local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"\" in source attribute of <joints> data <input> element",0x36);
            std::__cxx11::stringbuf::str();
            ThrowException(this,&local_1d8);
          }
          iVar2 = strcmp(pcVar5,"JOINT");
          psVar8 = &pController->mJointNameSource;
          psVar1 = &pController->mJointNameSource;
          if ((iVar2 != 0) &&
             (iVar2 = strcmp(pcVar5,"INV_BIND_MATRIX"),
             psVar8 = &pController->mJointOffsetMatrixSource,
             psVar1 = &pController->mJointOffsetMatrixSource, iVar2 != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unknown semantic \"",0x12);
            poVar7 = (ostream *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )local_1a8,&local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"\" in <joints> data <input> element",0x22);
            std::__cxx11::stringbuf::str();
            ThrowException(this,&local_1d8);
          }
          pcVar5 = (char *)psVar1->_M_string_length;
          strlen(pcVar6 + 1);
          std::__cxx11::string::_M_replace((ulong)psVar8,0,pcVar5,(ulong)(pcVar6 + 1));
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((char)iVar2 != '\0') goto LAB_004244b1;
        }
        SkipElement(this);
      }
      else if (iVar3 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_02,iVar2),"joints");
        if (iVar2 == 0) {
          return;
        }
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Expected end of <joints> element.","");
        ThrowException(this,local_1a8);
      }
LAB_004244b1:
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar2 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadControllerJoints(Collada::Controller& pController)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // Input channels for joint data. Two possible semantics: "JOINT" and "INV_BIND_MATRIX"
            if (IsElement("input"))
            {
                int indexSemantic = GetAttribute("semantic");
                const char* attrSemantic = mReader->getAttributeValue(indexSemantic);
                int indexSource = GetAttribute("source");
                const char* attrSource = mReader->getAttributeValue(indexSource);

                // local URLS always start with a '#'. We don't support global URLs
                if (attrSource[0] != '#')
                    ThrowException(format() << "Unsupported URL format in \"" << attrSource << "\" in source attribute of <joints> data <input> element");
                attrSource++;

                // parse source URL to corresponding source
                if (strcmp(attrSemantic, "JOINT") == 0)
                    pController.mJointNameSource = attrSource;
                else if (strcmp(attrSemantic, "INV_BIND_MATRIX") == 0)
                    pController.mJointOffsetMatrixSource = attrSource;
                else
                    ThrowException(format() << "Unknown semantic \"" << attrSemantic << "\" in <joints> data <input> element");

                // skip inner data, if present
                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "joints") != 0)
                ThrowException("Expected end of <joints> element.");

            break;
        }
    }
}